

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O2

enable_if_t<HasSize<InlinedVector<float,_4>_>::value_&&_HasData<InlinedVector<float,_4>_>::value,_std::ostream_&>
 pbrt::detail::operator<<
           (ostream *os,InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *v)

{
  ostream *poVar1;
  anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
  *paVar2;
  size_t i;
  ulong uVar3;
  
  std::operator<<(os,"[ ");
  paVar2 = &v->field_2;
  if ((anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
       *)v->ptr !=
      (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
       *)0x0) {
    paVar2 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
              *)v->ptr;
  }
  for (uVar3 = 0; uVar3 < v->nStored; uVar3 = uVar3 + 1) {
    std::ostream::operator<<(os,paVar2->fixed[uVar3]);
    if (uVar3 < v->nStored - 1) {
      std::operator<<(os,", ");
    }
  }
  poVar1 = std::operator<<(os," ]");
  return poVar1;
}

Assistant:

inline std::enable_if_t<HasSize<T>::value && HasData<T>::value, std::ostream &>
operator<<(std::ostream &os, const T &v) {
    os << "[ ";
    auto ptr = v.data();
    for (size_t i = 0; i < v.size(); ++i) {
        os << ptr[i];
        if (i < v.size() - 1)
            os << ", ";
    }
    return os << " ]";
}